

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  int iVar1;
  ImGuiWindow *window;
  bool bVar2;
  long lVar3;
  ImGuiWindow *window_00;
  ImGuiContext *g;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  lVar4 = (long)iVar1;
  uVar5 = iVar1 - 1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    do {
      if (lVar4 < 1) {
        lVar6 = 0xffffffff;
        break;
      }
      lVar6 = lVar4 + -1;
      lVar3 = lVar4 + -1;
      lVar4 = lVar6;
    } while ((GImGui->WindowsFocusOrder).Data[lVar3] != under_this_window);
    if ((int)lVar6 != -1) {
      uVar5 = (int)lVar6 - 1;
    }
  }
  if ((int)uVar5 < 0) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = (ImGuiWindow *)0x0;
    lVar4 = (ulong)uVar5 + 1;
    do {
      if (iVar1 <= (int)uVar5) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                      ,0x62f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (GImGui->WindowsFocusOrder).Data[lVar4 + -1];
      if ((((window != ignore_window) && (window->WasActive == true)) &&
          (window->RootWindowDockStop == window)) && ((~window->Flags & 0x40200U) != 0)) {
        window_00 = NavRestoreLastChildNavWindow(window);
        break;
      }
      lVar6 = lVar4 + -1;
      bVar2 = 0 < lVar4;
      lVar4 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && window->RootWindowDockStop == window)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}